

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitBinaryInt
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,OpCodeAsmJs op)

{
  AsmJsByteCodeWriter *this_00;
  ParseNode *pnode_00;
  ParseNode *this_01;
  AsmJsFunc *pAVar1;
  bool bVar2;
  Types TVar3;
  EmitInfoBase R0;
  ParseNodeBin *pPVar4;
  ParseNodeInt *pPVar5;
  RegisterSpace *pRVar6;
  AsmJsCompilationException *this_02;
  undefined4 uVar7;
  undefined8 in_RCX;
  AsmJsRetType local_50;
  undefined4 local_4c;
  EmitExpressionInfo local_48;
  EmitExpressionInfo local_40;
  EmitExpressionInfo local_38;
  undefined7 uVar8;
  
  pPVar4 = ParseNode::AsParseNodeBin(pnode);
  pnode_00 = pPVar4->pnode1;
  pPVar4 = ParseNode::AsParseNodeBin(pnode);
  this_01 = pPVar4->pnode2;
  if (this_01->nop == knopInt) {
    pPVar5 = ParseNode::AsParseNodeInt(this_01);
    uVar8 = (undefined7)((ulong)in_RCX >> 8);
    uVar7 = (undefined4)CONCAT71(uVar8,pPVar5->lw == 0);
    if (((op == Or_Int) && (pPVar5->lw == 0)) &&
       (uVar7 = (undefined4)CONCAT71(uVar8,1), pnode_00->nop == knopCall)) {
      AsmJsRetType::AsmJsRetType(&local_50,Signed);
      local_48 = EmitCall(this,pnode_00,local_50);
      bVar2 = AsmJsType::isIntish(&local_48.type);
      if (bVar2) {
        local_48.type.which_ = Signed;
        return local_48;
      }
      this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_02,
                 L"Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish"
                );
      goto LAB_00937991;
    }
  }
  else {
    uVar7 = 0;
  }
  local_4c = uVar7;
  local_40 = Emit(this,pnode_00);
  local_38 = Emit(this,this_01);
  bVar2 = AsmJsType::isIntish(&local_40.type);
  if ((bVar2) && (bVar2 = AsmJsType::isIntish(&local_38.type), bVar2)) {
    pAVar1 = this->mFunction;
    TVar3 = WAsmJs::FromPrimitiveType<int>();
    pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                       (&pAVar1->mTypedRegisterAllocator,TVar3);
    if ((local_40.super_EmitInfoBase.location == 0xffffffff) ||
       (pRVar6->mRegisterCount <= local_40.super_EmitInfoBase.location)) {
      this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_02,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
    }
    else {
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<int>();
      pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      if ((local_38.super_EmitInfoBase.location != 0xffffffff) &&
         (local_38.super_EmitInfoBase.location < pRVar6->mRegisterCount)) {
        this_00 = &this->mWriter;
        ByteCodeWriter::StartStatement(&this_00->super_ByteCodeWriter,pnode,0);
        local_48 = (EmitExpressionInfo)
                   ((ulong)CONCAT14(op == Shr_UInt,local_48.super_EmitInfoBase.location) |
                   0xa00000000);
        if (((byte)local_4c & op != And_Int) == 0) {
          R0.location = GetAndReleaseBinaryLocations<int>(this,&local_40,&local_38);
          AsmJsByteCodeWriter::AsmReg3
                    (this_00,op,R0.location,local_40.super_EmitInfoBase.location,
                     local_38.super_EmitInfoBase.location);
        }
        else {
          pAVar1 = this->mFunction;
          TVar3 = WAsmJs::FromPrimitiveType<int>();
          pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                             (&pAVar1->mTypedRegisterAllocator,TVar3);
          if (local_38.super_EmitInfoBase.location != 0xffffffff) {
            WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar6,local_38.super_EmitInfoBase.location);
          }
          R0.location = local_40.super_EmitInfoBase.location;
        }
        local_48.super_EmitInfoBase.location = R0.location;
        ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,pnode);
        return local_48;
      }
      this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_02,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
    }
  }
  else {
    this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_02,
               L"Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish");
  }
LAB_00937991:
  __cxa_throw(this_02,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitBinaryInt( ParseNode * pnode, OpCodeAsmJs op )
    {
        ParseNode* lhs = ParserWrapper::GetBinaryLeft( pnode );
        ParseNode* rhs = ParserWrapper::GetBinaryRight( pnode );
        const bool isRhs0 = rhs->nop == knopInt && rhs->AsParseNodeInt()->lw == 0;
        const bool isOr0Operation = op == OpCodeAsmJs::Or_Int && isRhs0;
        if( isOr0Operation && lhs->nop == knopCall )
        {
            EmitExpressionInfo info = EmitCall(lhs, AsmJsRetType::Signed);
            if (!info.type.isIntish())
            {
                throw AsmJsCompilationException(_u("Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish"));
            }
            info.type = AsmJsType::Signed;
            return info;
        }
        const EmitExpressionInfo& lhsEmit = Emit( lhs );
        const EmitExpressionInfo& rhsEmit = Emit( rhs );
        const AsmJsType& lType = lhsEmit.type;
        const AsmJsType& rType = rhsEmit.type;
        if( !lType.isIntish() || !rType.isIntish() )
        {
            throw AsmJsCompilationException( _u("Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish") );
        }
        CheckNodeLocation( lhsEmit, int );
        CheckNodeLocation( rhsEmit, int );
        StartStatement(pnode);
        EmitExpressionInfo emitInfo( AsmJsType::Signed );
        if( op == OpCodeAsmJs::Shr_UInt )
        {
            emitInfo.type = AsmJsType::Unsigned;
        }
        // ignore this specific operation, useful for non asm.js
        if( !isRhs0 || op == OpCodeAsmJs::And_Int )
        {
            RegSlot dstReg = GetAndReleaseBinaryLocations<int>( &lhsEmit, &rhsEmit );
            mWriter.AsmReg3( op, dstReg, lhsEmit.location, rhsEmit.location );
            emitInfo.location = dstReg;
        }
        else
        {
            mFunction->ReleaseLocation<int>( &rhsEmit );
            emitInfo.location = lhsEmit.location;
        }
        EndStatement(pnode);
        return emitInfo;
    }